

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O0

string * __thiscall
flatbuffers::go::GoGenerator::CastToEnum
          (string *__return_storage_ptr__,GoGenerator *this,Type *type,string *value)

{
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string *local_28;
  string *value_local;
  Type *type_local;
  GoGenerator *this_local;
  
  local_28 = value;
  value_local = (string *)type;
  type_local = (Type *)this;
  this_local = (GoGenerator *)__return_storage_ptr__;
  if (type->enum_def == (EnumDef *)0x0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)value);
  }
  else {
    GenTypeGet_abi_cxx11_(&local_88,this,type);
    std::operator+(&local_68,&local_88,"(");
    std::operator+(&local_48,&local_68,value);
    std::operator+(__return_storage_ptr__,&local_48,")");
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    std::__cxx11::string::~string((string *)&local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CastToEnum(const Type &type, std::string value) {
    if (type.enum_def == nullptr) {
      return value;
    } else {
      return GenTypeGet(type) + "(" + value + ")";
    }
  }